

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O2

Colourb Rml::InterpolateColour(Colourb c0,Colourb c1,float alpha)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Colourf CVar8;
  Colourf CVar9;
  Colour<float,_1,_false> CVar10;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  Colour<float,_1,_false> local_20;
  
  CVar8 = ColourToLinearSpace(c0);
  CVar9 = ColourToLinearSpace(c1);
  local_20.alpha = 1.0 - alpha;
  local_38 = CVar8.red;
  fStack_34 = CVar8.green;
  local_20.red = local_38 * local_20.alpha;
  local_20.green = fStack_34 * local_20.alpha;
  local_48 = CVar8.blue;
  fStack_44 = CVar8.alpha;
  local_20.blue = local_20.alpha * local_48;
  local_20.alpha = local_20.alpha * fStack_44;
  CVar10.red = CVar9.red * alpha;
  CVar10.green = CVar9.green * alpha;
  CVar10.blue = CVar9.blue * alpha;
  CVar10.alpha = CVar9.alpha * alpha;
  CVar10 = Colour<float,_1,_false>::operator+(&local_20,CVar10);
  fVar1 = Math::SquareRoot(CVar10.red);
  fVar1 = fVar1 * 255.0;
  fVar4 = 255.0;
  if (fVar1 <= 255.0) {
    fVar4 = fVar1;
  }
  fStack_44 = CVar10.green;
  fVar2 = Math::SquareRoot(fStack_44);
  fVar2 = fVar2 * 255.0;
  fVar5 = 255.0;
  if (fVar2 <= 255.0) {
    fVar5 = fVar2;
  }
  local_58 = CVar10.blue;
  fVar3 = Math::SquareRoot(local_58);
  fVar3 = fVar3 * 255.0;
  fVar6 = 255.0;
  if (fVar3 <= 255.0) {
    fVar6 = fVar3;
  }
  fStack_54 = CVar10.alpha;
  fStack_54 = fStack_54 * 255.0;
  fVar7 = 255.0;
  if (fStack_54 <= 255.0) {
    fVar7 = fStack_54;
  }
  return (Colourb)((int)(float)(~-(uint)(fVar1 < 0.0) & (uint)fVar4) & 0xffU |
                  ((int)(float)(~-(uint)(fVar2 < 0.0) & (uint)fVar5) & 0xffU) << 8 |
                  ((int)(float)(~-(uint)(fVar3 < 0.0) & (uint)fVar6) & 0xffU) << 0x10 |
                  (int)(float)(~-(uint)(fStack_54 < 0.0) & (uint)fVar7) << 0x18);
}

Assistant:

static Colourb InterpolateColour(Colourb c0, Colourb c1, float alpha)
{
	Colourf c0f = ColourToLinearSpace(c0);
	Colourf c1f = ColourToLinearSpace(c1);
	Colourf c = Mix(c0f, c1f, alpha);
	return ColourFromLinearSpace(c);
}